

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::readVertexAttrib(IVec4 *dst,VertexAttrib *vertexAttrib,int instanceNdx,int vertexNdx)

{
  int local_58;
  int local_54;
  anon_union_16_3_1194ccdc_for_v local_50;
  Vector<int,_4> local_40;
  int local_30;
  int local_2c;
  int byteOffset;
  int stride;
  int compSize;
  int elementNdx;
  int vertexNdx_local;
  int instanceNdx_local;
  VertexAttrib *vertexAttrib_local;
  IVec4 *dst_local;
  
  compSize = vertexNdx;
  elementNdx = instanceNdx;
  _vertexNdx_local = vertexAttrib;
  vertexAttrib_local = (VertexAttrib *)dst;
  if (vertexAttrib->pointer == (void *)0x0) {
    GenericVec4::get<int>((GenericVec4 *)&local_50);
    vertexAttrib_local->type = local_50._0_4_;
    vertexAttrib_local->size = local_50.uData[1];
    vertexAttrib_local->stride = local_50._8_4_;
    vertexAttrib_local->instanceDivisor = local_50.uData[3];
  }
  else {
    local_54 = vertexNdx;
    if (vertexAttrib->instanceDivisor != 0) {
      local_54 = instanceNdx / vertexAttrib->instanceDivisor;
    }
    stride = local_54;
    byteOffset = anon_unknown_1::getComponentSize(vertexAttrib->type);
    if (_vertexNdx_local->stride == 0) {
      local_58 = _vertexNdx_local->size * byteOffset;
    }
    else {
      local_58 = _vertexNdx_local->stride;
    }
    local_2c = local_58;
    local_30 = stride * local_58;
    tcu::Vector<int,_4>::Vector(&local_40,0,0,0,1);
    vertexAttrib_local->type = local_40.m_data[0];
    vertexAttrib_local->size = local_40.m_data[1];
    vertexAttrib_local->stride = local_40.m_data[2];
    vertexAttrib_local->instanceDivisor = local_40.m_data[3];
    anon_unknown_1::readInt
              ((IVec4 *)vertexAttrib_local,_vertexNdx_local->type,_vertexNdx_local->size,
               (void *)((long)_vertexNdx_local->pointer + (long)local_30));
  }
  return;
}

Assistant:

void readVertexAttrib (tcu::IVec4& dst, const VertexAttrib& vertexAttrib, const int instanceNdx, const int vertexNdx)
{
	DE_ASSERT(isValidVertexAttrib(vertexAttrib));

	if (vertexAttrib.pointer)
	{
		const int	elementNdx		= (vertexAttrib.instanceDivisor != 0) ? (instanceNdx / vertexAttrib.instanceDivisor) : vertexNdx;
		const int	compSize		= getComponentSize(vertexAttrib.type);
		const int	stride			= (vertexAttrib.stride != 0) ? (vertexAttrib.stride) : (vertexAttrib.size*compSize);
		const int	byteOffset		= elementNdx*stride;

		dst = tcu::IVec4(0, 0, 0, 1); // defaults
		readInt(dst, vertexAttrib.type, vertexAttrib.size, (const deUint8*)vertexAttrib.pointer + byteOffset);
	}
	else
	{
		dst = vertexAttrib.generic.get<deInt32>();
	}
}